

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O3

void __thiscall
VulkanUtilities::RenderingInfoWrapper::SetStencilAttachmentClearValue
          (RenderingInfoWrapper *this,uint32_t Stencil)

{
  uint uVar1;
  undefined8 in_RCX;
  bool bVar2;
  string msg;
  string local_38;
  
  bVar2 = (this->m_RI).pStencilAttachment == (VkRenderingAttachmentInfo *)0x0;
  uVar1 = this->m_StencilAttachmentIndex;
  if (uVar1 == 0xffffffff || bVar2) {
    Diligent::FormatString<char[26],char[70]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_RI.pStencilAttachment != nullptr && m_StencilAttachmentIndex != ~0u",
               (char (*) [70])CONCAT71((int7)((ulong)in_RCX >> 8),bVar2));
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetStencilAttachmentClearValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x79);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar1 = this->m_StencilAttachmentIndex;
  }
  (this->m_Attachments)._M_t.
  super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl[uVar1].clearValue.
  depthStencil.stencil = Stencil;
  uVar1 = this->m_StencilAttachmentIndex;
  (this->m_Attachments)._M_t.
  super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl[uVar1].loadOp =
       VK_ATTACHMENT_LOAD_OP_CLEAR;
  this->m_AttachmentClearMask = this->m_AttachmentClearMask | 1 << ((byte)uVar1 & 0x1f);
  return;
}

Assistant:

void SetStencilAttachmentClearValue(uint32_t Stencil)
    {
        VERIFY_EXPR(m_RI.pStencilAttachment != nullptr && m_StencilAttachmentIndex != ~0u);
        m_Attachments[m_StencilAttachmentIndex].clearValue.depthStencil.stencil = Stencil;
        m_Attachments[m_StencilAttachmentIndex].loadOp                          = VK_ATTACHMENT_LOAD_OP_CLEAR;
        m_AttachmentClearMask |= 1u << m_StencilAttachmentIndex;
    }